

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O0

void __thiscall
MetadataTest_AddLayerSpecificMetadataToImageNotAllowed_Test::
~MetadataTest_AddLayerSpecificMetadataToImageNotAllowed_Test
          (MetadataTest_AddLayerSpecificMetadataToImageNotAllowed_Test *this)

{
  void *in_RDI;
  
  ~MetadataTest_AddLayerSpecificMetadataToImageNotAllowed_Test
            ((MetadataTest_AddLayerSpecificMetadataToImageNotAllowed_Test *)0xbbcfd8);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(MetadataTest, AddLayerSpecificMetadataToImageNotAllowed) {
  aom_image_t image;
  image.metadata = nullptr;

  // OBU_METADATA_TYPE_SCALABILITY cannot be layer specific.
  ASSERT_EQ(
      aom_img_add_metadata(
          &image, OBU_METADATA_TYPE_SCALABILITY, kMetadataPayloadT35,
          kMetadataPayloadSizeT35,
          (aom_metadata_insert_flags_t)(AOM_MIF_ANY_FRAME_LAYER_SPECIFIC)),
      -1);
  aom_img_metadata_array_free(image.metadata);
}